

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Node * __thiscall GEO::FileSystem::Node::load_file_as_string(Node *this,string *path)

{
  char *__filename;
  void *__ptr;
  ostream *poVar1;
  string *in_RDX;
  allocator local_71;
  string local_70 [32];
  size_t local_50;
  size_t read_length;
  size_t length;
  FILE *local_30;
  FILE *f;
  string *local_20;
  string *path_local;
  Node *this_local;
  string *result;
  
  f._7_1_ = 0;
  local_20 = in_RDX;
  path_local = path;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  __filename = (char *)std::__cxx11::string::c_str();
  local_30 = fopen(__filename,"r");
  if (local_30 != (FILE *)0x0) {
    fseek(local_30,0,2);
    read_length = ftell(local_30);
    fseek(local_30,0,0);
    if (read_length != 0) {
      std::__cxx11::string::resize((ulong)this);
      __ptr = (void *)std::__cxx11::string::operator[]((ulong)this);
      local_50 = fread(__ptr,1,read_length,local_30);
      if (local_50 != read_length) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"FileSystem",&local_71);
        poVar1 = Logger::warn((string *)local_70);
        poVar1 = std::operator<<(poVar1,"Problem occured when reading ");
        poVar1 = std::operator<<(poVar1,local_20);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
    fclose(local_30);
  }
  return this;
}

Assistant:

std::string Node::load_file_as_string(const std::string& path) {
	    std::string result;
	    FILE* f = fopen(path.c_str(),"r");
	    if(f != nullptr) {
		// Get file length
		fseek(f, 0L, SEEK_END);
		size_t length = size_t(ftell(f));
		fseek(f, 0L, SEEK_SET);
		if(length != 0) {
		    result.resize(length);
		    size_t read_length = fread(&result[0], 1, length, f);
		    if(read_length != length) {
			Logger::warn("FileSystem")
			    << "Problem occured when reading "
			    << path
			    << std::endl;
			    
		    }
		}
		fclose(f);
	    }
	    return result;
	}